

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_usat16_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t shift)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)(short)x;
  if ((short)x < 0) {
    uVar3 = 0;
LAB_005bbd49:
    uVar1 = uVar3;
    env->QF = 1;
  }
  else {
    uVar3 = ~(-1 << ((byte)shift & 0x1f));
    if (uVar3 < uVar1) goto LAB_005bbd49;
  }
  uVar3 = (int)x >> 0x10;
  if ((int)uVar3 < 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = ~(-1 << ((byte)shift & 0x1f));
    if (uVar3 <= uVar2) goto LAB_005bbd73;
  }
  uVar3 = uVar2;
  env->QF = 1;
LAB_005bbd73:
  return uVar3 * 0x10000 + uVar1;
}

Assistant:

uint32_t HELPER(usat16)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    uint32_t res;

    res = (uint16_t)do_usat(env, (int16_t)x, shift);
    res |= do_usat(env, ((int32_t)x) >> 16, shift) << 16;
    return res;
}